

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationsTest::~VaryingLocationsTest(VaryingLocationsTest *this)

{
  VaryingLocationsTest *this_local;
  
  (this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__VaryingLocationsTest_0321f868;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->m_last_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->m_first_data);
  TextureTestBase::~TextureTestBase(&this->super_TextureTestBase);
  return;
}

Assistant:

~VaryingLocationsTest()
	{
	}